

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void find_coreGL(void)

{
  int iVar1;
  size_t __n;
  size_t length;
  char *prefixes [4];
  char *version;
  int minor;
  int major;
  int i;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  char *local_38 [5];
  int local_c;
  int local_8;
  int local_4;
  
  local_38[0] = "OpenGL ES-CM ";
  local_38[1] = "OpenGL ES-CL ";
  local_38[2] = "OpenGL ES ";
  local_38[3] = (char *)0x0;
  local_38[4] = (char *)(*glad_glGetString)(0x1f02);
  if ((GLubyte *)local_38[4] != (GLubyte *)0x0) {
    for (local_4 = 0; local_38[local_4] != (char *)0x0; local_4 = local_4 + 1) {
      __n = strlen(local_38[local_4]);
      iVar1 = strncmp(local_38[4],local_38[local_4],__n);
      if (iVar1 == 0) {
        local_38[4] = local_38[4] + __n;
        break;
      }
    }
    __isoc99_sscanf(local_38[4],"%d.%d",&local_8,&local_c);
    GLVersion.major = local_8;
    GLVersion.minor = local_c;
    max_loaded_major = local_8;
    max_loaded_minor = local_c;
    if ((local_8 != 1) || (local_41 = true, local_c < 0)) {
      local_41 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_0 = (int)local_41;
    if ((local_8 != 1) || (local_42 = true, local_c < 1)) {
      local_42 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_1 = (int)local_42;
    if ((local_8 != 1) || (local_43 = true, local_c < 2)) {
      local_43 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_2 = (int)local_43;
    if ((local_8 != 1) || (local_44 = true, local_c < 3)) {
      local_44 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_3 = (int)local_44;
    if ((local_8 != 1) || (local_45 = true, local_c < 4)) {
      local_45 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_4 = (int)local_45;
    if ((local_8 != 1) || (local_46 = true, local_c < 5)) {
      local_46 = 1 < local_8;
    }
    GLAD_GL_VERSION_1_5 = (int)local_46;
    if ((local_8 != 2) || (local_47 = true, local_c < 0)) {
      local_47 = 2 < local_8;
    }
    GLAD_GL_VERSION_2_0 = (int)local_47;
    if ((local_8 != 2) || (local_48 = true, local_c < 1)) {
      local_48 = 2 < local_8;
    }
    GLAD_GL_VERSION_2_1 = (int)local_48;
    if ((local_8 != 3) || (local_49 = true, local_c < 0)) {
      local_49 = 3 < local_8;
    }
    GLAD_GL_VERSION_3_0 = (int)local_49;
    if ((local_8 != 3) || (local_4a = true, local_c < 1)) {
      local_4a = 3 < local_8;
    }
    GLAD_GL_VERSION_3_1 = (int)local_4a;
    if ((local_8 != 3) || (local_4b = true, local_c < 2)) {
      local_4b = 3 < local_8;
    }
    GLAD_GL_VERSION_3_2 = (int)local_4b;
    if ((local_8 != 3) || (local_4c = true, local_c < 3)) {
      local_4c = 3 < local_8;
    }
    GLAD_GL_VERSION_3_3 = (int)local_4c;
    if ((3 < local_8) || ((2 < local_8 && (2 < local_c)))) {
      max_loaded_major = 3;
      max_loaded_minor = 3;
    }
  }
  return;
}

Assistant:

static void find_coreGL(void) {

    /* Thank you @elmindreda
     * https://github.com/elmindreda/greg/blob/master/templates/greg.c.in#L176
     * https://github.com/glfw/glfw/blob/master/src/context.c#L36
     */
    int i, major, minor;

    const char* version;
    const char* prefixes[] = {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    version = (const char*) glGetString(GL_VERSION);
    if (!version) return;

    for (i = 0;  prefixes[i];  i++) {
        const size_t length = strlen(prefixes[i]);
        if (strncmp(version, prefixes[i], length) == 0) {
            version += length;
            break;
        }
    }

/* PR #18 */
#ifdef _MSC_VER
    sscanf_s(version, "%d.%d", &major, &minor);
#else
    sscanf(version, "%d.%d", &major, &minor);
#endif

    GLVersion.major = major; GLVersion.minor = minor;
    max_loaded_major = major; max_loaded_minor = minor;
	GLAD_GL_VERSION_1_0 = (major == 1 && minor >= 0) || major > 1;
	GLAD_GL_VERSION_1_1 = (major == 1 && minor >= 1) || major > 1;
	GLAD_GL_VERSION_1_2 = (major == 1 && minor >= 2) || major > 1;
	GLAD_GL_VERSION_1_3 = (major == 1 && minor >= 3) || major > 1;
	GLAD_GL_VERSION_1_4 = (major == 1 && minor >= 4) || major > 1;
	GLAD_GL_VERSION_1_5 = (major == 1 && minor >= 5) || major > 1;
	GLAD_GL_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
	GLAD_GL_VERSION_2_1 = (major == 2 && minor >= 1) || major > 2;
	GLAD_GL_VERSION_3_0 = (major == 3 && minor >= 0) || major > 3;
	GLAD_GL_VERSION_3_1 = (major == 3 && minor >= 1) || major > 3;
	GLAD_GL_VERSION_3_2 = (major == 3 && minor >= 2) || major > 3;
	GLAD_GL_VERSION_3_3 = (major == 3 && minor >= 3) || major > 3;
	if (GLVersion.major > 3 || (GLVersion.major >= 3 && GLVersion.minor >= 3)) {
		max_loaded_major = 3;
		max_loaded_minor = 3;
	}
}